

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_&,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_*>
::increment(btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_&,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_*>
            *this)

{
  btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  bVar1;
  btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *pbVar2;
  undefined8 uVar3;
  bool bVar4;
  byte i;
  btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *pbVar5;
  btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *pbVar6;
  int iVar7;
  char *__function;
  int iStack_20;
  
  pbVar6 = this->node_;
  if (((ulong)pbVar6 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descripto..." /* TRUNCATED STRING LITERAL */
                 );
  }
  if ((pbVar6[0xb] !=
       (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
        )0x0) &&
     (iVar7 = this->position_ + 1, this->position_ = iVar7, iVar7 < (int)(uint)(byte)pbVar6[10])) {
    return;
  }
  pbVar6 = this->node_;
  if (((ulong)pbVar6 & 7) == 0) {
    iVar7 = this->position_;
    if (pbVar6[0xb] ==
        (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar6[10] <= iVar7) {
        __assert_fail("position_ < node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x85e,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>, std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> &, std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>, Reference = std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> &, Pointer = std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> *]"
                     );
      }
      i = (char)iVar7 + 1;
      while( true ) {
        pbVar6 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                 ::child(pbVar6,i);
        this->node_ = pbVar6;
        if (((ulong)pbVar6 & 7) != 0) break;
        bVar1 = pbVar6[0xb];
        i = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            ::start(pbVar6);
        if (bVar1 != (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                      )0x0) {
          this->position_ = (uint)i;
          return;
        }
      }
    }
    else {
      if (iVar7 < (int)(uint)(byte)pbVar6[10]) {
        __assert_fail("position_ >= node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x852,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>, std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> &, std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>, Reference = std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> &, Pointer = std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> *]"
                     );
      }
      pbVar2 = this->node_;
      uVar3 = *(undefined8 *)&this->position_;
      pbVar6 = this->node_;
      while (((ulong)pbVar6 & 7) == 0) {
        if ((this->position_ != (uint)(byte)pbVar6[10]) ||
           (bVar4 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    ::is_root(pbVar6), bVar4)) {
          if (((ulong)this->node_ & 7) == 0) {
            if (this->position_ != (uint)(byte)this->node_[10]) {
              return;
            }
            iStack_20 = (int)uVar3;
            this->position_ = iStack_20;
            this->node_ = pbVar2;
            return;
          }
          break;
        }
        pbVar6 = this->node_;
        if (((ulong)pbVar6 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descripto..." /* TRUNCATED STRING LITERAL */
          ;
          goto LAB_00f432cc;
        }
        pbVar5 = btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                 ::child(*(btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                           **)pbVar6,(field_type)pbVar6[8]);
        pbVar6 = this->node_;
        if (pbVar5 != pbVar6) {
          __assert_fail("node_->parent()->child(node_->position()) == node_",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                        ,0x855,
                        "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>, std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> &, std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>>, Reference = std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> &, Pointer = std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *> *]"
                       );
        }
        if (((ulong)pbVar6 & 7) != 0) break;
        this->position_ = (uint)(byte)pbVar6[8];
        pbVar6 = *(btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                   **)pbVar6;
        this->node_ = pbVar6;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descriptor *, int>>, std::allocator<std::pair<const std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::pair<const google::protobuf::Descriptor *, int>, const google::protobuf::FieldDescriptor *, std::less<std::pair<const google::protobuf::Descripto..." /* TRUNCATED STRING LITERAL */
  ;
LAB_00f432cc:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

void increment() {
    assert_valid_generation(node_);
    if (node_->is_leaf() && ++position_ < node_->finish()) {
      return;
    }
    increment_slow();
  }